

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

KTXTexture2 __thiscall ktx::CommandCreate::createTexture(CommandCreate *this,ImageSpec *target)

{
  __optional_gt_t<unsigned_int,_unsigned_int> _Var1;
  bool bVar2;
  uint32_t uVar3;
  int extraout_EAX;
  uint uVar4;
  khr_df_primaries_e kVar5;
  khr_df_transfer_e kVar6;
  int iVar7;
  uint *puVar8;
  ktxTexture2 **ppkVar9;
  ktxTexture2 *pkVar10;
  Origin *pOVar11;
  undefined8 uVar12;
  ImageSpec *in_RDX;
  long in_RSI;
  ktxTexture2 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  double __x;
  string orientation;
  ktx_error_code_e ret;
  uint32_t maxLevels;
  uint maxDimension;
  ktxTextureCreateInfo createInfo;
  KTXTexture2 *texture;
  uint *in_stack_fffffffffffffe88;
  string *psVar13;
  optional<unsigned_int> *in_stack_fffffffffffffe90;
  ktxHashList *ppkVar14;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  char (*in_stack_fffffffffffffef8) [46];
  ReturnCode in_stack_ffffffffffffff04;
  Reporter *in_stack_ffffffffffffff08;
  undefined4 local_c4;
  string local_a8 [32];
  undefined8 local_88;
  int local_70;
  undefined1 local_69;
  undefined4 local_68;
  int local_64;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t local_58;
  uint local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined1 local_48 [4];
  undefined4 local_44;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t local_30;
  undefined4 local_2c;
  uint local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined1 local_1c;
  undefined1 local_1b;
  ImageSpec *local_18;
  
  local_18 = in_RDX;
  memset(local_48,0,0x30);
  uVar3 = ImageSpec::depth(local_18);
  if (uVar3 != *(uint32_t *)(in_RSI + 1000)) {
    __assert_fail("target.depth() == baseDepth",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                  ,0x98e,"KTXTexture2 ktx::CommandCreate::createTexture(const ImageSpec &)");
  }
  local_44 = *(undefined4 *)(in_RSI + 0x4c);
  local_20 = *(undefined4 *)(in_RSI + 0x3e4);
  local_24 = *(undefined4 *)(in_RSI + 0x3e0);
  local_4c = 0;
  local_1c = std::operator>(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_38 = ImageSpec::width(local_18);
  local_34 = ImageSpec::height(local_18);
  local_30 = ImageSpec::depth(local_18);
  if ((*(byte *)(in_RSI + 0x48) & 1) == 0) {
    local_50 = 0;
    _Var1 = std::operator>(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    local_c4 = 2;
    if (_Var1) {
      local_c4 = 3;
    }
  }
  else {
    local_c4 = 1;
  }
  local_2c = local_c4;
  if ((*(byte *)(in_RSI + 0xec) & 1) == 0) {
    local_1b = 0;
    if ((*(byte *)(in_RSI + 0xed) & 1) == 0) {
      local_68 = 1;
      local_28 = std::optional<unsigned_int>::value_or<int>
                           ((optional<unsigned_int> *)
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            (int *)in_stack_fffffffffffffe90);
    }
    else {
      local_58 = ImageSpec::width(local_18);
      local_5c = ImageSpec::height(local_18);
      local_60 = ImageSpec::depth(local_18);
      puVar8 = std::max<unsigned_int>(&local_5c,&local_60);
      puVar8 = std::max<unsigned_int>(&local_58,puVar8);
      local_54 = *puVar8;
      log2(__x);
      local_64 = extraout_EAX + 1;
      local_28 = std::optional<unsigned_int>::value_or<unsigned_int_const&>
                           ((optional<unsigned_int> *)
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            (uint *)in_stack_fffffffffffffe90);
    }
  }
  else {
    local_1b = 1;
    local_28 = 1;
  }
  local_69 = 0;
  KTXTexture2::KTXTexture2((KTXTexture2 *)in_RDI,(nullptr_t)0x0);
  ppkVar9 = KTXTexture2::pHandle((KTXTexture2 *)in_RDI);
  local_70 = ktxTexture2_Create(local_48,1,ppkVar9);
  if (local_70 != 0) {
    local_88 = ktxErrorString(local_70);
    Reporter::fatal<char_const(&)[46],char_const*>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
               (char **)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  pkVar10 = KTXTexture2::operator->((KTXTexture2 *)in_RDI);
  uVar4 = pkVar10->pDfd[3] & 0xffff00ff;
  ImageSpec::format(local_18);
  kVar5 = FormatDescriptor::primaries((FormatDescriptor *)0x1e0685);
  uVar4 = uVar4 | (kVar5 & KHR_DF_PRIMARIES_MAX) << 8;
  pkVar10 = KTXTexture2::operator->((KTXTexture2 *)in_RDI);
  pkVar10->pDfd[3] = uVar4;
  pkVar10 = KTXTexture2::operator->((KTXTexture2 *)in_RDI);
  uVar4 = pkVar10->pDfd[3];
  ImageSpec::format(local_18);
  kVar6 = FormatDescriptor::transfer((FormatDescriptor *)0x1e0708);
  pkVar10 = KTXTexture2::operator->((KTXTexture2 *)in_RDI);
  pkVar10->pDfd[3] = uVar4 & 0xff00ffff | (kVar6 & KHR_DF_TRANSFER_MAX) << 0x10;
  bVar2 = std::optional<ImageSpec::Origin>::has_value((optional<ImageSpec::Origin> *)0x1e0759);
  if ((bVar2) ||
     (bVar2 = std::optional<ImageSpec::Origin>::has_value((optional<ImageSpec::Origin> *)0x1e0775),
     bVar2)) {
    std::__cxx11::string::string(local_a8);
    std::__cxx11::string::resize((ulong)local_a8);
    pOVar11 = ImageSpec::origin(local_18);
    if (pOVar11->x == '\0') {
      local_148 = "r";
    }
    else {
      local_148 = "l";
    }
    std::__cxx11::string::operator=(local_a8,local_148);
    if ((*(byte *)(in_RSI + 0x48) & 1) == 0) {
      pOVar11 = ImageSpec::origin(local_18);
      if (pOVar11->y == '\0') {
        local_150 = "d";
      }
      else {
        local_150 = "u";
      }
      std::__cxx11::string::operator+=(local_a8,local_150);
      bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x1e0856);
      if (bVar2) {
        pOVar11 = ImageSpec::origin(local_18);
        if (pOVar11->z == '\0') {
          local_158 = "i";
        }
        else {
          local_158 = "o";
        }
        std::__cxx11::string::operator+=(local_a8,local_158);
      }
    }
    pkVar10 = KTXTexture2::operator->((KTXTexture2 *)in_RDI);
    ppkVar14 = &pkVar10->kvDataHead;
    psVar13 = local_a8;
    iVar7 = std::__cxx11::string::size();
    iVar7 = iVar7 + 1;
    uVar12 = std::__cxx11::string::c_str();
    ktxHashList_AddKVPair(ppkVar14,"KTXorientation",iVar7,uVar12,in_R8,in_R9,psVar13);
    std::__cxx11::string::~string(local_a8);
  }
  return (KTXTexture2)in_RDI;
}

Assistant:

KTXTexture2 CommandCreate::createTexture(const ImageSpec& target) {
    ktxTextureCreateInfo createInfo;
    std::memset(&createInfo, 0, sizeof(createInfo));

    assert(target.depth() == baseDepth);

    createInfo.vkFormat = options.vkFormat;
    createInfo.numFaces = numFaces;
    createInfo.numLayers = numLayers;
    createInfo.isArray = options.layers > 0u;
    createInfo.baseWidth = target.width();
    createInfo.baseHeight = target.height();
    createInfo.baseDepth = target.depth();
    createInfo.numDimensions = options._1d ? 1 : (options.depth > 0u ? 3 : 2);

    if (options.mipmapRuntime) {
        createInfo.generateMipmaps = true;
        createInfo.numLevels = 1;
    } else {
        createInfo.generateMipmaps = false;
        if (options.mipmapGenerate) {
            const auto maxDimension = std::max(target.width(), std::max(target.height(), target.depth()));
            const auto maxLevels = log2(maxDimension) + 1;
            createInfo.numLevels = options.levels.value_or(maxLevels);
        } else {
            createInfo.numLevels = options.levels.value_or(1);
        }
    }

    KTXTexture2 texture{nullptr};
    ktx_error_code_e ret = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE, texture.pHandle());
    if (KTX_SUCCESS != ret)
        fatal(rc::KTX_FAILURE, "Failed to create ktxTexture: libktx error: {}", ktxErrorString(ret));

    KHR_DFDSETVAL(texture->pDfd + 1, PRIMARIES, target.format().primaries());
    KHR_DFDSETVAL(texture->pDfd + 1, TRANSFER, target.format().transfer());

    // Add KTXorientation metadata
    if (options.assignTexcoordOrigin.has_value() || options.convertTexcoordOrigin.has_value()) {
        // This code is future-proofed by supporting "right" origin and 1d
        // textures. Current imitations are enforced by CL option parsing.
        std::string orientation;
        orientation.resize(3);
        orientation = target.origin().x == ImageSpec::Origin::eLeft ? "r" : "l";
        if (!options._1d) {
            orientation += target.origin().y == ImageSpec::Origin::eTop ? "d" : "u";
            if (options.depth.has_value()) {
                orientation += target.origin().z == ImageSpec::Origin::eFront ? "i" : "o";
            }
        }

        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_ORIENTATION_KEY,
                static_cast<uint32_t>(orientation.size() + 1), // +1 to include the \0
                orientation.c_str());
    }

    return texture;
}